

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O2

void __thiscall facenet::Reduction_B(facenet *this,pBox *input,pBox *output)

{
  pBox *pbox;
  pBox *pbox_00;
  pBox *pbox_01;
  pBox *pbox_02;
  pBox *pbox_03;
  pBox *pbox_04;
  pBox *pbox_05;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  Weight *weight_05;
  pBox *c4;
  BN *bn;
  BN *bn_00;
  BN *bn_01;
  BN *bn_02;
  BN *bn_03;
  BN *bn_04;
  BN *bn_05;
  BN *bn_06;
  BN *bn_07;
  BN *bn_08;
  BN *bn_09;
  BN *bn_10;
  BN *bn_11;
  BN *bn_12;
  BN *bn_13;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  mydataFmt *pointTeam [28];
  long dataNumber [28];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string filename;
  string local_50;
  
  pbox = (pBox *)operator_new(0x38);
  (pbox->super_String)._M_dataplus._M_p = (pointer)&(pbox->super_String).field_2;
  (pbox->super_String)._M_string_length = 0;
  (pbox->super_String).field_2._M_local_buf[0] = '\0';
  pbox_00 = (pBox *)operator_new(0x38);
  (pbox_00->super_String)._M_dataplus._M_p = (pointer)&(pbox_00->super_String).field_2;
  (pbox_00->super_String)._M_string_length = 0;
  (pbox_00->super_String).field_2._M_local_buf[0] = '\0';
  pbox_01 = (pBox *)operator_new(0x38);
  (pbox_01->super_String)._M_dataplus._M_p = (pointer)&(pbox_01->super_String).field_2;
  (pbox_01->super_String)._M_string_length = 0;
  (pbox_01->super_String).field_2._M_local_buf[0] = '\0';
  pbox_02 = (pBox *)operator_new(0x38);
  (pbox_02->super_String)._M_dataplus._M_p = (pointer)&(pbox_02->super_String).field_2;
  (pbox_02->super_String)._M_string_length = 0;
  (pbox_02->super_String).field_2._M_local_buf[0] = '\0';
  pbox_03 = (pBox *)operator_new(0x38);
  (pbox_03->super_String)._M_dataplus._M_p = (pointer)&(pbox_03->super_String).field_2;
  (pbox_03->super_String)._M_string_length = 0;
  (pbox_03->super_String).field_2._M_local_buf[0] = '\0';
  pbox_04 = (pBox *)operator_new(0x38);
  (pbox_04->super_String)._M_dataplus._M_p = (pointer)&(pbox_04->super_String).field_2;
  (pbox_04->super_String)._M_string_length = 0;
  (pbox_04->super_String).field_2._M_local_buf[0] = '\0';
  pbox_05 = (pBox *)operator_new(0x38);
  (pbox_05->super_String)._M_dataplus._M_p = (pointer)&(pbox_05->super_String).field_2;
  (pbox_05->super_String)._M_string_length = 0;
  (pbox_05->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  weight_05 = (Weight *)operator_new(0x38);
  c4 = (pBox *)operator_new(0x38);
  (c4->super_String)._M_dataplus._M_p = (pointer)&(c4->super_String).field_2;
  (c4->super_String)._M_string_length = 0;
  (c4->super_String).field_2._M_local_buf[0] = '\0';
  bn = (BN *)operator_new(0x10);
  bn_00 = (BN *)operator_new(0x10);
  bn_01 = (BN *)operator_new(0x10);
  bn_02 = (BN *)operator_new(0x10);
  bn_03 = (BN *)operator_new(0x10);
  bn_04 = (BN *)operator_new(0x10);
  bn_05 = (BN *)operator_new(0x10);
  bn_06 = (BN *)operator_new(0x10);
  bn_07 = (BN *)operator_new(0x10);
  bn_08 = (BN *)operator_new(0x10);
  bn_09 = (BN *)operator_new(0x10);
  bn_10 = (BN *)operator_new(0x10);
  bn_11 = (BN *)operator_new(0x10);
  bn_12 = (BN *)operator_new(0x10);
  bn_13 = (BN *)operator_new(0x10);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  lVar1 = ConvAndFcInit(weight,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(bn_01,bn_00,bn,0x100);
  lVar2 = ConvAndFcInit(weight_00,0x180,0x100,3,2,0,0,0,0,0);
  BatchNormInit(bn_04,bn_03,bn_02,0x180);
  lVar3 = ConvAndFcInit(weight_01,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(bn_07,bn_06,bn_05,0x100);
  lVar4 = ConvAndFcInit(weight_02,0x100,0x100,3,2,0,0,0,0,0);
  BatchNormInit(bn_10,bn_09,bn_08,0x100);
  lVar5 = ConvAndFcInit(weight_03,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(bn_13,bn_12,bn_11,0x100);
  lVar6 = ConvAndFcInit(weight_04,0x100,0x100,3,1,1,0,0,0,0);
  BatchNormInit(beta,mean,var,0x100);
  lVar7 = ConvAndFcInit(weight_05,0x100,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0x100);
  dataNumber[1] = 0x100;
  dataNumber[2] = 0x100;
  dataNumber[3] = 0x100;
  dataNumber[5] = 0x180;
  dataNumber[6] = 0x180;
  dataNumber[7] = 0x180;
  dataNumber[9] = 0x100;
  dataNumber[10] = 0x100;
  dataNumber[0xb] = 0x100;
  dataNumber[0xd] = 0x100;
  dataNumber[0xe] = 0x100;
  dataNumber[0xf] = 0x100;
  dataNumber[0x11] = 0x100;
  dataNumber[0x12] = 0x100;
  dataNumber[0x13] = 0x100;
  dataNumber[0x15] = 0x100;
  dataNumber[0x16] = 0x100;
  dataNumber[0x17] = 0x100;
  dataNumber[0x19] = 0x100;
  dataNumber[0x1a] = 0x100;
  dataNumber[0x1b] = 0x100;
  pointTeam[0] = weight->pdata;
  pointTeam[1] = bn_01->pdata;
  pointTeam[2] = bn_00->pdata;
  pointTeam[3] = bn->pdata;
  pointTeam[4] = weight_00->pdata;
  pointTeam[5] = bn_04->pdata;
  pointTeam[6] = bn_03->pdata;
  pointTeam[7] = bn_02->pdata;
  pointTeam[8] = weight_01->pdata;
  pointTeam[9] = bn_07->pdata;
  pointTeam[10] = bn_06->pdata;
  pointTeam[0xb] = bn_05->pdata;
  pointTeam[0xc] = weight_02->pdata;
  pointTeam[0xd] = bn_10->pdata;
  pointTeam[0xe] = bn_09->pdata;
  pointTeam[0xf] = bn_08->pdata;
  pointTeam[0x10] = weight_03->pdata;
  pointTeam[0x11] = bn_13->pdata;
  pointTeam[0x12] = bn_12->pdata;
  pointTeam[0x13] = bn_11->pdata;
  pointTeam[0x14] = weight_04->pdata;
  pointTeam[0x15] = beta->pdata;
  pointTeam[0x16] = mean->pdata;
  pointTeam[0x17] = var->pdata;
  pointTeam[0x18] = weight_05->pdata;
  pointTeam[0x19] = beta_00->pdata;
  pointTeam[0x1a] = mean_00->pdata;
  pointTeam[0x1b] = var_00->pdata;
  dataNumber[0] = lVar1;
  dataNumber[4] = lVar2;
  dataNumber[8] = lVar3;
  dataNumber[0xc] = lVar4;
  dataNumber[0x10] = lVar5;
  dataNumber[0x14] = lVar6;
  dataNumber[0x18] = lVar7;
  std::__cxx11::to_string(&local_50,0x80);
  std::operator+(&local_90,"../model_",&local_50);
  std::operator+(&filename,&local_90,"/Mixed_7a_list.txt");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_b0,(string *)&filename);
  readData(&local_b0,dataNumber,pointTeam,0x1c);
  std::__cxx11::string::~string((string *)&local_b0);
  maxPoolingInit(input,c4,3,2,1);
  maxPooling(input,c4,3,2);
  convolutionInit(weight,input,pbox);
  convolution(weight,input,pbox);
  BatchNorm(pbox,bn_01,bn_00,bn);
  relu(pbox,weight->pbias);
  convolutionInit(weight_00,pbox,pbox_00);
  convolution(weight_00,pbox,pbox_00);
  BatchNorm(pbox_00,bn_04,bn_03,bn_02);
  relu(pbox_00,weight_00->pbias);
  convolutionInit(weight_01,input,pbox_01);
  convolution(weight_01,input,pbox_01);
  BatchNorm(pbox_01,bn_07,bn_06,bn_05);
  relu(pbox_01,weight_01->pbias);
  convolutionInit(weight_02,pbox_01,pbox_02);
  convolution(weight_02,pbox_01,pbox_02);
  BatchNorm(pbox_02,bn_10,bn_09,bn_08);
  relu(pbox_02,weight_02->pbias);
  convolutionInit(weight_03,input,pbox_03);
  convolution(weight_03,input,pbox_03);
  BatchNorm(pbox_03,bn_13,bn_12,bn_11);
  relu(pbox_03,weight_03->pbias);
  convolutionInit(weight_04,pbox_03,pbox_04);
  convolution(weight_04,pbox_03,pbox_04);
  BatchNorm(pbox_04,beta,mean,var);
  relu(pbox_04,weight_04->pbias);
  convolutionInit(weight_05,pbox_04,pbox_05);
  convolution(weight_05,pbox_04,pbox_05);
  BatchNorm(pbox_05,beta_00,mean_00,var_00);
  relu(pbox_05,weight_05->pbias);
  conv_mergeInit(output,pbox_00,pbox_02,pbox_05,c4);
  conv_merge(output,pbox_00,pbox_02,pbox_05,c4);
  freepBox(pbox);
  freepBox(pbox_00);
  freepBox(pbox_01);
  freepBox(pbox_02);
  freepBox(pbox_03);
  freepBox(pbox_04);
  freepBox(pbox_05);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeWeight(weight_05);
  freepBox(c4);
  freeBN(bn);
  freeBN(bn_00);
  freeBN(bn_01);
  freeBN(bn_02);
  freeBN(bn_03);
  freeBN(bn_04);
  freeBN(bn_05);
  freeBN(bn_06);
  freeBN(bn_07);
  freeBN(bn_08);
  freeBN(bn_09);
  freeBN(bn_10);
  freeBN(bn_11);
  freeBN(bn_12);
  freeBN(bn_13);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void facenet::Reduction_B(pBox *input, pBox *output) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;
    pBox *conv7_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;
    struct Weight *conv7_wb = new Weight;

    struct pBox *pooling1_out = new pBox;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;
    struct BN *conv5_var = new BN;
    struct BN *conv5_mean = new BN;
    struct BN *conv5_beta = new BN;
    struct BN *conv6_var = new BN;
    struct BN *conv6_mean = new BN;
    struct BN *conv6_beta = new BN;
    struct BN *conv7_var = new BN;
    struct BN *conv7_mean = new BN;
    struct BN *conv7_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 256);
    long conv2 = ConvAndFcInit(conv2_wb, 384, 256, 3, 2, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 384);

    long conv3 = ConvAndFcInit(conv3_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 256);
    long conv4 = ConvAndFcInit(conv4_wb, 256, 256, 3, 2, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 256);

    long conv5 = ConvAndFcInit(conv5_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv5_beta, conv5_mean, conv5_var, 256);
    long conv6 = ConvAndFcInit(conv6_wb, 256, 256, 3, 1, 1);
    BatchNormInit(conv6_beta, conv6_mean, conv6_var, 256);
    long conv7 = ConvAndFcInit(conv7_wb, 256, 256, 3, 2, 0);
    BatchNormInit(conv7_beta, conv7_mean, conv7_var, 256);

    long dataNumber[28] = {conv1, 256, 256, 256, conv2, 384, 384, 384, conv3, 256, 256, 256, conv4, 256, 256, 256,
                           conv5, 256, 256, 256, conv6, 256, 256, 256, conv7, 256, 256, 256};

//    mydataFmt *pointTeam[28] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_var->pdata, conv5_mean->pdata, conv5_beta->pdata, \
//                            conv6_wb->pdata, conv6_var->pdata, conv6_mean->pdata, conv6_beta->pdata, \
//                            conv7_wb->pdata, conv7_var->pdata, conv7_mean->pdata, conv7_beta->pdata};
    mydataFmt *pointTeam[28] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_beta->pdata, conv5_mean->pdata, conv5_var->pdata, \
                            conv6_wb->pdata, conv6_beta->pdata, conv6_mean->pdata, conv6_var->pdata, \
                            conv7_wb->pdata, conv7_beta->pdata, conv7_mean->pdata, conv7_var->pdata};
    string filename = "../model_" + to_string(Num) + "/Mixed_7a_list.txt";
    readData(filename, dataNumber, pointTeam, 28);


    maxPoolingInit(input, pooling1_out, 3, 2, 1);
    // 8*8*896
    maxPooling(input, pooling1_out, 3, 2);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 17 x 17 x 256
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
//    BatchNorm(conv1_out, conv1_var, conv1_mean, conv1_beta);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, conv1_out, conv2_out);
    //conv2 8 x 8 x 384
    convolution(conv2_wb, conv1_out, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
//    BatchNorm(conv2_out, conv2_var, conv2_mean, conv2_beta);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, input, conv3_out);
    //conv3 17 x 17 x 256
    convolution(conv3_wb, input, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
//    BatchNorm(conv3_out, conv3_var, conv3_mean, conv3_beta);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 8 x 8 x 256
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);

    convolutionInit(conv5_wb, input, conv5_out);
    //conv5 17 x 17 x 256
    convolution(conv5_wb, input, conv5_out);
    BatchNorm(conv5_out, conv5_beta, conv5_mean, conv5_var);
    relu(conv5_out, conv5_wb->pbias);

    convolutionInit(conv6_wb, conv5_out, conv6_out);
    //conv6 17 x 17 x 256
    convolution(conv6_wb, conv5_out, conv6_out);
    BatchNorm(conv6_out, conv6_beta, conv6_mean, conv6_var);
    relu(conv6_out, conv6_wb->pbias);

    convolutionInit(conv7_wb, conv6_out, conv7_out);
    //conv6 8 x 8 x 256
    convolution(conv7_wb, conv6_out, conv7_out);
    BatchNorm(conv7_out, conv7_beta, conv7_mean, conv7_var);
    relu(conv7_out, conv7_wb->pbias);

    conv_mergeInit(output, conv2_out, conv4_out, conv7_out, pooling1_out);
    //8*8*1792
    conv_merge(output, conv2_out, conv4_out, conv7_out, pooling1_out);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);
    freepBox(conv7_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);
    freeWeight(conv7_wb);

    freepBox(pooling1_out);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
    freeBN(conv5_var);
    freeBN(conv5_mean);
    freeBN(conv5_beta);
    freeBN(conv6_var);
    freeBN(conv6_mean);
    freeBN(conv6_beta);
    freeBN(conv7_var);
    freeBN(conv7_mean);
    freeBN(conv7_beta);
}